

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O0

void __thiscall rtosc::UndoHistory::showHistory(UndoHistory *this)

{
  bool bVar1;
  reference ppVar2;
  char *pcVar3;
  undefined8 *in_RDI;
  rtosc_arg_t rVar4;
  pair<long,_const_char_*> s;
  iterator __end1;
  iterator __begin1;
  deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_> *__range1;
  int i;
  _Self *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  char *pcVar5;
  char *in_stack_ffffffffffffff80;
  char *local_78;
  _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
  local_38;
  undefined8 local_18;
  uint local_c;
  
  local_c = 0;
  local_18 = *in_RDI;
  std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::begin
            ((deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
              *)in_stack_ffffffffffffff68);
  std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::end
            ((deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
              *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::operator!=((_Self *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff68);
    if (!bVar1) break;
    ppVar2 = std::
             _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
             ::operator*(&local_38);
    pcVar3 = ppVar2->second;
    in_stack_ffffffffffffff74 = local_c;
    pcVar5 = pcVar3;
    local_c = local_c + 1;
    rVar4 = rtosc_argument(in_stack_ffffffffffffff80,(uint)((ulong)pcVar3 >> 0x20));
    local_78 = (char *)rVar4.d;
    pcVar3 = rtosc_argument_string(pcVar3);
    printf("#%d type: %s dest: %s arguments: %s\n",(ulong)in_stack_ffffffffffffff74,pcVar5,local_78,
           pcVar3);
    std::
    _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
    ::operator++((_Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
                  *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    in_stack_ffffffffffffff80 = local_78;
  }
  return;
}

Assistant:

void UndoHistory::showHistory(void) const
{
    int i = 0;
    for(auto s : impl->history)
        printf("#%d type: %s dest: %s arguments: %s\n", i++,
                s.second, rtosc_argument(s.second, 0).s, rtosc_argument_string(s.second));
}